

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTexture.cpp
# Opt level: O2

bool __thiscall
sf::RenderTexture::create(RenderTexture *this,uint width,uint height,bool depthBuffer)

{
  bool bVar1;
  undefined7 in_register_00000009;
  ContextSettings local_1c;
  
  local_1c.depthBits = (int)CONCAT71(in_register_00000009,depthBuffer) << 5;
  local_1c.stencilBits = 0;
  local_1c.antialiasingLevel = 0;
  local_1c.majorVersion = 1;
  local_1c.minorVersion = 1;
  local_1c.attributeFlags = 0;
  local_1c.sRgbCapable = false;
  bVar1 = create(this,width,height,&local_1c);
  return bVar1;
}

Assistant:

bool RenderTexture::create(unsigned int width, unsigned int height, bool depthBuffer)
{
    return create(width, height, ContextSettings(depthBuffer ? 32 : 0));
}